

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cc
# Opt level: O0

void libyuv::ScaleAddCols0_C
               (int dst_width,int boxheight,int x,int dx,uint16_t *src_ptr,uint8_t *dst_ptr)

{
  int i;
  int scaleval;
  uint8_t *dst_ptr_local;
  uint16_t *src_ptr_local;
  int dx_local;
  int x_local;
  int boxheight_local;
  int dst_width_local;
  
  dst_ptr_local = dst_ptr;
  for (i = 0; i < dst_width; i = i + 1) {
    *dst_ptr_local =
         (uint8_t)((uint)src_ptr[(long)(x >> 0x10) + (long)i] * (int)(0x10000 / (long)boxheight) >>
                  0x10);
    dst_ptr_local = dst_ptr_local + 1;
  }
  return;
}

Assistant:

static void ScaleAddCols0_C(int dst_width,
                            int boxheight,
                            int x,
                            int dx,
                            const uint16_t* src_ptr,
                            uint8_t* dst_ptr) {
  int scaleval = 65536 / boxheight;
  int i;
  (void)dx;
  src_ptr += (x >> 16);
  for (i = 0; i < dst_width; ++i) {
    *dst_ptr++ = src_ptr[i] * scaleval >> 16;
  }
}